

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<6,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int row;
  long lVar1;
  bool bVar2;
  float *pfVar3;
  long lVar4;
  undefined1 auVar5 [16];
  bool bVar7;
  float fVar8;
  Type in0;
  Matrix<float,_2,_3> res;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  long lVar6;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar1 = 0;
    do {
      fVar8 = 1.0;
      if (lVar1 != 0) {
        fVar8 = 0.0;
      }
      in0.m_data.m_data[0].m_data[lVar1] = fVar8;
      fVar8 = 1.0;
      if (lVar1 != 1) {
        fVar8 = 0.0;
      }
      in0.m_data.m_data[1].m_data[lVar1] = fVar8;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in0.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    in0.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    lVar1 = 0;
    do {
      fVar8 = (float)(&DAT_00af09d4)[lVar1 * 2];
      in0.m_data.m_data[0].m_data[lVar1] =
           (float)(&sr::(anonymous_namespace)::s_constInMat2x3)[lVar1 * 2];
      in0.m_data.m_data[1].m_data[lVar1] = fVar8;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[2].m_data[0] = 0.0;
  res.m_data.m_data[2].m_data[1] = 0.0;
  lVar1 = 0;
  pfVar3 = (float *)&res;
  bVar7 = true;
  do {
    bVar2 = bVar7;
    lVar4 = 0;
    auVar5 = _DAT_00a99400;
    do {
      bVar7 = SUB164(auVar5 ^ _DAT_00a99450,4) == -0x80000000 &&
              SUB164(auVar5 ^ _DAT_00a99450,0) < -0x7ffffffd;
      if (bVar7) {
        fVar8 = 1.0;
        if (lVar1 != lVar4) {
          fVar8 = 0.0;
        }
        pfVar3[lVar4 * 2] = fVar8;
      }
      if (bVar7) {
        fVar8 = 1.0;
        if (lVar1 + -1 != lVar4) {
          fVar8 = 0.0;
        }
        pfVar3[lVar4 * 2 + 2] = fVar8;
      }
      lVar4 = lVar4 + 2;
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
    } while (lVar4 != 4);
    lVar1 = 1;
    pfVar3 = res.m_data.m_data[0].m_data + 1;
    bVar7 = false;
  } while (bVar2);
  lVar1 = 0;
  do {
    fVar8 = in0.m_data.m_data[1].m_data[lVar1];
    res.m_data.m_data[lVar1].m_data[0] = in0.m_data.m_data[0].m_data[lVar1];
    res.m_data.m_data[lVar1].m_data[1] = fVar8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_28 = CONCAT44(res.m_data.m_data[1].m_data[1] + res.m_data.m_data[1].m_data[0],
                      res.m_data.m_data[0].m_data[0] + res.m_data.m_data[0].m_data[1]);
  local_20 = res.m_data.m_data[2].m_data[0] + res.m_data.m_data[2].m_data[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}